

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Events.c
# Opt level: O2

void event_go_to_breakfast_time(tgestate_t *state)

{
  state->bell = '(';
  queue_message(state,message_BREAKFAST_TIME);
  set_hero_route(state,(route_t *)&set_route_go_to_breakfast_t16);
  set_prisoners_and_guards_route_B(state,(route_t *)&set_route_go_to_breakfast_t16);
  return;
}

Assistant:

static void event_go_to_breakfast_time(tgestate_t *state)
{
  assert(state != NULL);

  state->bell = bell_RING_40_TIMES;
  queue_message(state, message_BREAKFAST_TIME);
  set_route_go_to_breakfast(state);
}